

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O2

int is_octal(char *p,size_t len)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x4c) {
      return 1;
    }
    pcVar1 = p + lVar2;
    lVar2 = lVar2 + 1;
  } while (0xf7 < (byte)(*pcVar1 - 0x38U));
  return 0;
}

Assistant:

static int
is_octal(const char *p, size_t len)
{
	while (len-- > 0) {
		if (*p < '0' || *p > '7')
			return (0);
	        ++p;
	}
	return (1);
}